

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringCache.cpp
# Opt level: O0

JavascriptString * __thiscall
Js::CharStringCache::GetStringForCharSP(CharStringCache *this,codepoint_t c)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptLibrary *this_00;
  ScriptContext *this_01;
  JavascriptString *pJVar4;
  JavascriptString *str;
  ScriptContext *pSStack_20;
  char16 buffer [2];
  ScriptContext *scriptContext;
  codepoint_t c_local;
  CharStringCache *this_local;
  
  if (c < 0x10000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CharStringCache.cpp"
                                ,0x4f,"(c >= 0x10000)","c >= 0x10000");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this_00 = JavascriptLibrary::FromCharStringCache(this);
  this_01 = JavascriptLibrary::GetScriptContext(this_00);
  pSStack_20 = this_01;
  if (0x10ffff < c) {
    pJVar4 = ScriptContext::GetIntegerString(this_01,c);
    JavascriptError::ThrowRangeError(this_01,-0x7ff5ea20,pJVar4);
  }
  NumberUtilities::CodePointAsSurrogatePair(c,(char16 *)((long)&str + 4),(char16 *)((long)&str + 6))
  ;
  pJVar4 = JavascriptString::NewCopyBuffer((char16 *)((long)&str + 4),2,pSStack_20);
  return pJVar4;
}

Assistant:

JavascriptString* CharStringCache::GetStringForCharSP(codepoint_t c)
    {
        Assert(c >= 0x10000);
        CompileAssert(sizeof(char16) * 2 == sizeof(codepoint_t));

        ScriptContext* scriptContext = JavascriptLibrary::FromCharStringCache(this)->GetScriptContext();

        // #sec - string.fromcodepoint: "If nextCP < 0 or nextCP > 0x10FFFF, throw a RangeError exception"
        if (c > 0x10FFFF)
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_InvalidCodePoint, scriptContext->GetIntegerString(c));
        }

        char16 buffer[2];

        Js::NumberUtilities::CodePointAsSurrogatePair(c, buffer, buffer + 1);
        JavascriptString* str = JavascriptString::NewCopyBuffer(buffer, 2, scriptContext);
        // TODO: perhaps do some sort of cache for supplementary characters
        return str;
    }